

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorBits.c
# Opt level: O0

void InsertVarsWithoutClearing(Cube *pC,int *pVars,int nVarsIn,int *pVarValues,int Output)

{
  int iVar1;
  int local_3c;
  int i;
  int LocalBit;
  int LocalWord;
  int GlobalBit;
  int Output_local;
  int *pVarValues_local;
  int nVarsIn_local;
  int *pVars_local;
  Cube *pC_local;
  
  if ((nVarsIn < 1) || (g_CoverInfo.nVarsIn < nVarsIn)) {
    __assert_fail("nVarsIn > 0 && nVarsIn <= g_CoverInfo.nVarsIn",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorBits.c"
                  ,0x194,"void InsertVarsWithoutClearing(Cube *, int *, int, int *, int)");
  }
  local_3c = 0;
  while( true ) {
    if (nVarsIn <= local_3c) {
      pC->pCubeDataOut[Output >> 5] = 1 << ((byte)Output & 0x1f) | pC->pCubeDataOut[Output >> 5];
      return;
    }
    if ((pVars[local_3c] < 0) || (g_CoverInfo.nVarsIn <= pVars[local_3c])) break;
    if (((pVarValues[local_3c] != 1) && (pVarValues[local_3c] != 2)) && (pVarValues[local_3c] != 3))
    {
      __assert_fail("pVarValues[i] == VAR_NEG || pVarValues[i] == VAR_POS || pVarValues[i] == VAR_ABS"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorBits.c"
                    ,0x198,"void InsertVarsWithoutClearing(Cube *, int *, int, int *, int)");
    }
    iVar1 = (pVars[local_3c] << 1) >> 5;
    pC->pCubeDataIn[iVar1] =
         pVarValues[local_3c] << ((byte)(pVars[local_3c] << 1) & 0x1f) | pC->pCubeDataIn[iVar1];
    local_3c = local_3c + 1;
  }
  __assert_fail("pVars[i] >= 0 && pVars[i] < g_CoverInfo.nVarsIn",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorBits.c"
                ,0x197,"void InsertVarsWithoutClearing(Cube *, int *, int, int *, int)");
}

Assistant:

void InsertVarsWithoutClearing( Cube * pC, int * pVars, int nVarsIn, int * pVarValues, int Output )
// corrects the given number of variables (nVarsIn) in pC->pCubeDataIn[]
// variable numbers are given in pVarNumbers[], their values are in pVarValues[]
// arrays pVarNumbers[] and pVarValues[] are provided by the user
{
    int GlobalBit;
    int LocalWord;
    int LocalBit;
    int i;
    assert( nVarsIn > 0 && nVarsIn <= g_CoverInfo.nVarsIn );
    for ( i = 0; i < nVarsIn; i++ )
    {
        assert( pVars[i] >= 0 && pVars[i] < g_CoverInfo.nVarsIn );
        assert( pVarValues[i] == VAR_NEG || pVarValues[i] == VAR_POS || pVarValues[i] == VAR_ABS );
        GlobalBit = (pVars[i]<<1);
        LocalWord = VarWord(GlobalBit);
        LocalBit  = VarBit(GlobalBit);

        // correct this variables
        pC->pCubeDataIn[LocalWord] |= ( pVarValues[i] << LocalBit );
    }
    // insert the output bit
    pC->pCubeDataOut[VarWord(Output)] |= ( 1 << VarBit(Output) );
}